

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::set_simplex(Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
              *this,diameter_entry_t _simplex,dimension_t _dim)

{
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *__return_storage_ptr__;
  undefined1 idx [16];
  vertex_t vVar1;
  simplex_t *psVar2;
  diameter_entry_t *in_RDX;
  undefined8 extraout_RDX;
  diameter_entry_t *p;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *out;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *this_00;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
  local_48 [8];
  vector<int,_std::allocator<int>_> local_40;
  simplex_t *local_28;
  dimension_t local_11;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  *pSStack_10;
  dimension_t _dim_local;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  *this_local;
  
  this_00 = (Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
             *)&_simplex;
  local_11 = _dim;
  pSStack_10 = this;
  local_28 = Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
             ::get_index((simplex_t *)this->parent,this_00,in_RDX);
  *(undefined8 *)((long)&this->idx_below + 8) = extraout_RDX;
  *(simplex_t **)&this->idx_below = local_28;
  *(undefined8 *)((long)&this->idx_above + 8) = 0;
  *(undefined8 *)&this->idx_above = 0;
  vVar1 = Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::size
                    (this->dist);
  this->j = vVar1 + -1;
  this->k = local_11 + '\x01';
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  ::diameter_entry_t::operator=(&this->simplex,(diameter_entry_t *)this_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,(long)(local_11 + 1));
  __return_storage_ptr__ = this->parent;
  psVar2 = Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
           ::get_index((simplex_t *)__return_storage_ptr__,this_00,p);
  local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)psVar2;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::size(this->dist);
  std::vector<int,_std::allocator<int>_>::rbegin(&local_40);
  idx._8_8_ = this_00;
  idx._0_8_ = &local_40;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (local_48,(simplex_t)idx,(dimension_t)__return_storage_ptr__,(vertex_t)psVar2,out);
  return;
}

Assistant:

void set_simplex(const diameter_entry_t _simplex, const dimension_t _dim) {
      idx_below = parent.get_index(_simplex);
      idx_above = 0;
      j = dist.size() - 1;
      k = _dim + 1;
      simplex = _simplex;
      vertices.resize(_dim + 1);
      parent.get_simplex_vertices(parent.get_index(_simplex), _dim, dist.size(), vertices.rbegin());
    }